

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O2

int Gia_ManCombMarkUsed_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  char *__assertion;
  uint uVar8;
  
  if (pObj != (Gia_Obj_t *)0x0) {
    uVar8 = (uint)*(ulong *)pObj;
    if ((uVar8 >> 0x1e & 1) != 0) {
      *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff;
      if (((int)uVar8 < 0) || ((uVar8 & 0x1fffffff) == 0x1fffffff)) {
        __assertion = "Gia_ObjIsAnd(pObj)";
        uVar8 = 0x34;
      }
      else {
        iVar2 = Gia_ObjIsBuf(pObj);
        if (iVar2 == 0) {
          iVar2 = Gia_ManCombMarkUsed_rec(p,pObj + -(ulong)(uVar8 & 0x1fffffff));
          iVar3 = Gia_ManCombMarkUsed_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff))
          ;
          iVar5 = 0;
          iVar4 = 0;
          if (p->pNexts != (int *)0x0) {
            iVar4 = Gia_ObjId(p,pObj);
            if (p->pNexts[iVar4] == 0) {
              pGVar7 = (Gia_Obj_t *)0x0;
            }
            else {
              pGVar7 = Gia_ManObj(p,p->pNexts[iVar4]);
            }
            iVar4 = Gia_ManCombMarkUsed_rec(p,pGVar7);
          }
          if (p->pSibls != (int *)0x0) {
            iVar5 = Gia_ObjId(p,pObj);
            if ((p->pSibls == (int *)0x0) || (iVar5 = p->pSibls[iVar5], iVar5 == 0)) {
              pGVar7 = (Gia_Obj_t *)0x0;
            }
            else {
              pGVar7 = Gia_ManObj(p,iVar5);
            }
            iVar5 = Gia_ManCombMarkUsed_rec(p,pGVar7);
          }
          puVar1 = p->pMuxes;
          if (puVar1 == (uint *)0x0) {
            iVar6 = 0;
          }
          else {
            iVar6 = Gia_ObjId(p,pObj);
            uVar8 = puVar1[iVar6];
            if ((int)uVar8 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            pGVar7 = Gia_ManObj(p,uVar8 >> 1);
            iVar6 = Gia_ManCombMarkUsed_rec(p,pGVar7);
          }
          return iVar2 + iVar3 + 1 + iVar4 + iVar5 + iVar6;
        }
        __assertion = "!Gia_ObjIsBuf(pObj)";
        uVar8 = 0x35;
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaScl.c"
                    ,uVar8,"int Gia_ManCombMarkUsed_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
  }
  return 0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Marks unreachable internal nodes and returns their number.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManCombMarkUsed_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( pObj == NULL )
        return 0;
    if ( !pObj->fMark0 )
        return 0;
    pObj->fMark0 = 0;
    assert( Gia_ObjIsAnd(pObj) );
    assert( !Gia_ObjIsBuf(pObj) );
    return 1 + Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin0(pObj) )
             + Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin1(pObj) )
             + (p->pNexts ? Gia_ManCombMarkUsed_rec( p, Gia_ObjNextObj(p, Gia_ObjId(p, pObj)) ) : 0)
             + (p->pSibls ? Gia_ManCombMarkUsed_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)) ) : 0)
             + (p->pMuxes ? Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin2(p, pObj) ) : 0);
}